

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O2

Duration __thiscall absl::lts_20250127::operator-(lts_20250127 *this,Duration d)

{
  uint32_t uVar1;
  Duration DVar2;
  Duration DVar3;
  Duration DVar4;
  
  uVar1 = d.rep_hi_.lo_;
  if (uVar1 == 0xffffffff) {
    DVar2.rep_hi_ = (HiRep)(((long)this >> 0x3f) + -0x8000000000000000);
    DVar2.rep_lo_ = 0xffffffff;
    return DVar2;
  }
  if (uVar1 != 0) {
    DVar3.rep_hi_ = (HiRep)~(ulong)this;
    DVar3.rep_lo_ = 4000000000 - uVar1;
    return DVar3;
  }
  DVar4.rep_hi_ = -(long)this;
  DVar4.rep_lo_ = 0;
  return DVar4;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr Duration operator-(Duration d) {
  // This is a little interesting because of the special cases.
  //
  // If rep_lo_ is zero, we have it easy; it's safe to negate rep_hi_, we're
  // dealing with an integral number of seconds, and the only special case is
  // the maximum negative finite duration, which can't be negated.
  //
  // Infinities stay infinite, and just change direction.
  //
  // Finally we're in the case where rep_lo_ is non-zero, and we can borrow
  // a second's worth of ticks and avoid overflow (as negating int64_t-min + 1
  // is safe).
  return time_internal::GetRepLo(d) == 0
             ? time_internal::GetRepHi(d) ==
                       (std::numeric_limits<int64_t>::min)()
                   ? InfiniteDuration()
                   : time_internal::MakeDuration(-time_internal::GetRepHi(d))
             : time_internal::IsInfiniteDuration(d)
                   ? time_internal::OppositeInfinity(d)
                   : time_internal::MakeDuration(
                         time_internal::NegateAndSubtractOne(
                             time_internal::GetRepHi(d)),
                         time_internal::kTicksPerSecond -
                             time_internal::GetRepLo(d));
}